

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void init_beam(void)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  bool bVar5;
  unique_ptr<spatial_region,_std::default_delete<spatial_region>_> this;
  long lVar6;
  double cmr;
  double dVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  double n0;
  undefined8 in_XMM5_Qa;
  double x0b;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  
  lVar6 = (long)mpi_rank;
  bVar5 = std::operator==(&beam_particles_abi_cxx11_,"p");
  this = psr;
  if (bVar5) {
    n0 = (Nb * 1.061e-11) / (rb * rb * xb * lambda);
    bVar5 = 0.0 < epsb;
    bVar4 = epsb < 0.0;
    dVar7 = (epsb * epsb) / 0.261121 + -1.0;
    if (dVar7 < 0.0) {
      dVar7 = sqrt(dVar7);
    }
    else {
      auVar8._8_8_ = 0;
      auVar8._0_8_ = dVar7;
      auVar11 = vsqrtsd_avx(auVar8,auVar8);
      dVar7 = auVar11._0_8_;
    }
    dVar7 = dVar7 * (double)(int)((uint)bVar5 - (uint)bVar4);
    auVar14._0_8_ =
         (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                 ._M_start[lVar6];
    auVar14._8_8_ = in_XMM5_Qa;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = dx;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = xlength - ::x0b;
    auVar11 = vfnmadd132sd_fma(auVar14,auVar10,auVar2);
    x0b = auVar11._0_8_;
    cmr = 1.0;
  }
  else {
    bVar5 = std::operator==(&beam_particles_abi_cxx11_,"ph");
    this = psr;
    n0 = (Nb * 1.061e-11) / (rb * xb * rb * lambda);
    if (bVar5) {
      dVar7 = epsb / 0.511;
      auVar13._0_8_ =
           (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar6];
      auVar13._8_8_ = in_XMM5_Qa;
      auVar1._8_8_ = 0;
      auVar1._0_8_ = dx;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = xlength - ::x0b;
      auVar11 = vfnmadd132sd_fma(auVar13,auVar9,auVar1);
      x0b = auVar11._0_8_;
      cmr = 0.0;
    }
    else {
      bVar5 = 0.0 < epsb;
      bVar4 = epsb < 0.0;
      dVar7 = (epsb * epsb) / 0.261121 + -1.0;
      if (dVar7 < 0.0) {
        dVar7 = sqrt(dVar7);
      }
      else {
        auVar11._8_8_ = 0;
        auVar11._0_8_ = dVar7;
        auVar11 = vsqrtsd_avx(auVar11,auVar11);
        dVar7 = auVar11._0_8_;
      }
      dVar7 = dVar7 * (double)(int)((uint)bVar5 - (uint)bVar4);
      auVar15._0_8_ =
           (double)x0_sr.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar6];
      auVar15._8_8_ = in_XMM5_Qa;
      auVar3._8_8_ = 0;
      auVar3._0_8_ = dx;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = xlength - ::x0b;
      auVar11 = vfnmadd132sd_fma(auVar15,auVar12,auVar3);
      x0b = auVar11._0_8_;
      cmr = -1.0;
    }
  }
  spatial_region::add_beam
            ((spatial_region *)
             this._M_t.super___uniq_ptr_impl<spatial_region,_std::default_delete<spatial_region>_>.
             _M_t.super__Tuple_impl<0UL,_spatial_region_*,_std::default_delete<spatial_region>_>.
             super__Head_base<0UL,_spatial_region_*,_false>._M_head_impl,cmr,n0,dVar7,xb,rb,x0b,y0b,
             phib);
  return;
}

Assistant:

void init_beam()
{
    int i = mpi_rank;
    if (beam_particles=="p")
        psr->add_beam(1,Nb*1.061e-11/(xb*rb*rb*lambda),((epsb>0)-(epsb<0))*sqrt(epsb*epsb/(0.511*0.511)-1),xb,rb,xlength-x0b-dx*x0_sr[i],y0b,phib);
    else if (beam_particles=="ph")
        psr->add_beam(0,Nb*1.061e-11/(xb*rb*rb*lambda),epsb/0.511,xb,rb,xlength-x0b-dx*x0_sr[i],y0b,phib);
    else
        psr->add_beam(-1,Nb*1.061e-11/(xb*rb*rb*lambda),((epsb>0)-(epsb<0))*sqrt(epsb*epsb/(0.511*0.511)-1),xb,rb,xlength-x0b-dx*x0_sr[i],y0b,phib);
}